

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O0

void __thiscall pg::NPPSolver::~NPPSolver(NPPSolver *this)

{
  deque<unsigned_int,_std::allocator<unsigned_int>_> *pdVar1;
  bitset *pbVar2;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *plVar3;
  reference ppdVar4;
  reference ppbVar5;
  reference pplVar6;
  uint local_14;
  uint i;
  NPPSolver *this_local;
  
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__NPPSolver_0029c5b8;
  if (this->inverse != (int *)0x0) {
    operator_delete__(this->inverse);
  }
  ppdVar4 = std::
            vector<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ::operator[](&this->Heads,0);
  pdVar1 = *ppdVar4;
  if (pdVar1 != (deque<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::~deque(pdVar1);
    operator_delete(pdVar1,0x50);
  }
  ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[](&this->Exits,0);
  pbVar2 = *ppbVar5;
  if (pbVar2 != (bitset *)0x0) {
    bitset::~bitset(pbVar2);
    operator_delete(pbVar2,0x20);
  }
  pplVar6 = std::
            vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
            ::operator[](&this->Entries,0);
  plVar3 = *pplVar6;
  if (plVar3 != (list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)0x0) {
    std::__cxx11::
    list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~list(plVar3);
    operator_delete(plVar3,0x18);
  }
  for (local_14 = 1; local_14 <= this->End; local_14 = local_14 + 1) {
    ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                        (&this->Supgame,(ulong)local_14);
    pbVar2 = *ppbVar5;
    if (pbVar2 != (bitset *)0x0) {
      bitset::~bitset(pbVar2);
      operator_delete(pbVar2,0x20);
    }
    ppdVar4 = std::
              vector<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
              ::operator[](&this->Heads,(ulong)local_14);
    pdVar1 = *ppdVar4;
    if (pdVar1 != (deque<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::~deque(pdVar1);
      operator_delete(pdVar1,0x50);
    }
    ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                        (&this->Exits,(ulong)local_14);
    pbVar2 = *ppbVar5;
    if (pbVar2 != (bitset *)0x0) {
      bitset::~bitset(pbVar2);
      operator_delete(pbVar2,0x20);
    }
    pplVar6 = std::
              vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
              ::operator[](&this->Entries,(ulong)local_14);
    plVar3 = *pplVar6;
    if (plVar3 != (list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)0x0) {
      std::__cxx11::
      list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~list(plVar3);
      operator_delete(plVar3,0x18);
    }
  }
  uintqueue::~uintqueue(&this->E);
  uintqueue::~uintqueue(&this->T);
  bitset::~bitset(&this->O);
  bitset::~bitset(&this->D);
  bitset::~bitset(&this->R);
  std::
  vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
  ::~vector(&this->Entries);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::~vector(&this->Exits);
  std::
  vector<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::~vector(&this->Heads);
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::~vector(&this->Supgame);
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->Phase);
  bitset::~bitset(&this->winzero);
  bitset::~bitset(&this->outgame);
  Solver::~Solver(&this->super_Solver);
  return;
}

Assistant:

NPPSolver::~NPPSolver()
{
    delete[] inverse;
    delete Heads[0];
    delete Exits[0];
    delete Entries[0];
    for (uint i = 1; i <= End; ++i)
    {
        delete Supgame[i];
        delete Heads[i];
        delete Exits[i];
        delete Entries[i];
    }
}